

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::killShip(Player *this,int shipId)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_28;
  int local_24;
  int i;
  int j;
  int length;
  int headY;
  int headX;
  int shipId_local;
  Player *this_local;
  
  iVar2 = Ship::getShipHeadi((Ship *)(&this->field_0x264 + (long)shipId * 0x20));
  iVar3 = Ship::getShipHeadj((Ship *)(&this->field_0x264 + (long)shipId * 0x20));
  iVar4 = Ship::getShipLength((Ship *)(&this->field_0x264 + (long)shipId * 0x20));
  bVar1 = Ship::getRotation((Ship *)(&this->field_0x264 + (long)shipId * 0x20));
  local_28 = iVar3;
  local_24 = iVar3;
  if (bVar1) {
    for (; local_24 <= iVar3 + iVar4 + -1; local_24 = local_24 + 1) {
      this->playerArea[iVar2][local_24] = 200;
    }
  }
  else {
    for (; local_28 <= iVar3 + iVar4 + -1; local_28 = local_28 + 1) {
      this->playerArea[local_28][iVar3] = 200;
    }
  }
  return;
}

Assistant:

void Player::killShip(int shipId)
{
    int headX,headY,length;
    headX = playerFleet[shipId].getShipHeadi();
    headY = playerFleet[shipId].getShipHeadj();
    length = playerFleet[shipId].getShipLength();

    if(playerFleet[shipId].getRotation())
    {
        for(int j = headY; j <= headY+length-1; j++)
        {
            playerArea[headX][j] = Player::KILLED_CODE;

        }

    }
    else
    {
        for(int i = headY; i <= headY + length - 1; i++)
            playerArea[i][headY] = Player::KILLED_CODE;
    }


}